

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription::getSolution
          (MultipleShootingTranscription *this,
          vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_> *states,
          vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_> *controls)

{
  bool bVar1;
  size_type sVar2;
  pointer paVar3;
  reference pvVar4;
  vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_> *in_RDX;
  vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_> *in_RSI;
  long in_RDI;
  iterator mesh;
  MeshPointOrigin first;
  size_t controlIndex;
  size_t stateIndex;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> solutionMap;
  MeshPointOrigin *in_stack_fffffffffffffe78;
  MeshPointOrigin *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe98;
  uint in_stack_fffffffffffffe9c;
  vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
  *in_stack_fffffffffffffea0;
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffea8;
  __normal_iterator<iDynTree::optimalcontrol::MeshPoint_*,_std::vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>_>
  local_98 [10];
  size_type local_48;
  size_type local_40;
  vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_> *local_20;
  vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_> *local_18;
  byte local_1;
  
  if ((*(byte *)(in_RDI + 0x6f8) & 1) == 0) {
    iDynTree::reportError
              ("MultipleShootingTranscription","getSolution",
               "First you need to solve the problem once.");
    local_1 = 0;
  }
  else {
    local_20 = in_RDX;
    local_18 = in_RSI;
    sVar2 = std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::size
                      (in_RSI);
    if (sVar2 != *(long *)(in_RDI + 0x48) - 1U) {
      std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::resize
                (in_stack_fffffffffffffea0,
                 CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    }
    sVar2 = std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::size
                      (local_20);
    if (sVar2 != *(size_type *)(in_RDI + 0x50)) {
      std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::resize
                (in_stack_fffffffffffffea0,
                 CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    }
    toEigen((VectorDynSize *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    local_40 = 0;
    local_48 = 0;
    MeshPointOrigin::FirstPoint();
    local_98[0]._M_current =
         (anon_struct_112_6_78b70dfe *)
         std::
         vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>
         ::begin((vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>
                  *)in_stack_fffffffffffffe78);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<iDynTree::optimalcontrol::MeshPoint_*,_std::vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>_>
                               *)in_stack_fffffffffffffe80,
                              (__normal_iterator<iDynTree::optimalcontrol::MeshPoint_*,_std::vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>_>
                               *)in_stack_fffffffffffffe78), bVar1) {
      __gnu_cxx::
      __normal_iterator<iDynTree::optimalcontrol::MeshPoint_*,_std::vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>_>
      ::operator->(local_98);
      bVar1 = MeshPointOrigin::operator!=(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      if (bVar1) {
        std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::operator[]
                  (local_18,local_40);
        in_stack_fffffffffffffe80 = (MeshPointOrigin *)iDynTree::VectorDynSize::size();
        if (in_stack_fffffffffffffe80 != *(MeshPointOrigin **)(in_RDI + 200)) {
          pvVar4 = std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::
                   operator[](local_18,local_40);
          iDynTree::VectorDynSize::resize((ulong)pvVar4);
        }
        __gnu_cxx::
        __normal_iterator<iDynTree::optimalcontrol::MeshPoint_*,_std::vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>_>
        ::operator->(local_98);
        Eigen::
        DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>::
        segment<unsigned_int>
                  (in_stack_fffffffffffffea8,(Index)in_stack_fffffffffffffea0,
                   in_stack_fffffffffffffe9c);
        std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::operator[]
                  (local_18,local_40);
        toEigen((VectorDynSize *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>::operator=
                  ((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
                   in_stack_fffffffffffffe80,
                   (DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>_>
                    *)in_stack_fffffffffffffe78);
        local_40 = local_40 + 1;
      }
      paVar3 = __gnu_cxx::
               __normal_iterator<iDynTree::optimalcontrol::MeshPoint_*,_std::vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>_>
               ::operator->(local_98);
      if (paVar3->type == Control) {
        std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::operator[]
                  (local_20,local_48);
        in_stack_fffffffffffffe78 = (MeshPointOrigin *)iDynTree::VectorDynSize::size();
        if (in_stack_fffffffffffffe78 != *(MeshPointOrigin **)(in_RDI + 0xd0)) {
          pvVar4 = std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::
                   operator[](local_20,local_48);
          iDynTree::VectorDynSize::resize((ulong)pvVar4);
        }
        __gnu_cxx::
        __normal_iterator<iDynTree::optimalcontrol::MeshPoint_*,_std::vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>_>
        ::operator->(local_98);
        Eigen::
        DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>::
        segment<long>(in_stack_fffffffffffffea8,(Index)in_stack_fffffffffffffea0,
                      CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::operator[]
                  (local_20,local_48);
        toEigen((VectorDynSize *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>::operator=
                  ((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
                   in_stack_fffffffffffffe80,
                   (DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>_>
                    *)in_stack_fffffffffffffe78);
        local_48 = local_48 + 1;
      }
      __gnu_cxx::
      __normal_iterator<iDynTree::optimalcontrol::MeshPoint_*,_std::vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>_>
      ::operator++(local_98);
    }
    local_1 = 1;
    MeshPointOrigin::~MeshPointOrigin(in_stack_fffffffffffffe80);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool getSolution(std::vector<VectorDynSize>& states, std::vector<VectorDynSize>& controls) {
                if (!(m_solved)){
                    reportError("MultipleShootingTranscription", "getSolution", "First you need to solve the problem once.");
                    return false;
                }

                if (states.size() != (m_totalMeshes - 1)) {
                    states.resize((m_totalMeshes - 1));
                }

                if (controls.size() != m_controlMeshes) {
                    controls.resize(m_controlMeshes);
                }

                Eigen::Map<Eigen::VectorXd> solutionMap = toEigen(m_solution);

                size_t stateIndex = 0, controlIndex = 0;

                MeshPointOrigin first = MeshPointOrigin::FirstPoint();

                for (auto mesh = m_meshPoints.begin(); mesh != m_meshPointsEnd; ++mesh){
                    if (mesh->origin != first){
                        if (states[stateIndex].size() !=  m_nx) {
                            states[stateIndex].resize(static_cast<unsigned int>(m_nx));
                        }

                        toEigen(states[stateIndex]) = solutionMap.segment(static_cast<unsigned int>(mesh->stateIndex), static_cast<unsigned int>(m_nx));
                        stateIndex++;
                    }
                    if (mesh->type == MeshPointType::Control){
                        if (controls[controlIndex].size() !=  m_nu) {
                            controls[controlIndex].resize(static_cast<unsigned int>(m_nu));
                        }

                        toEigen(controls[controlIndex]) = solutionMap.segment(static_cast<Eigen::Index>(mesh->controlIndex), static_cast<Eigen::Index>(m_nu));
                        controlIndex++;
                    }
                }

                return true;
            }